

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip_x86.cpp
# Opt level: O0

int __thiscall ncnn::Clip_x86::forward_inplace(Clip_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  float *pfVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  long lVar5;
  int iVar6;
  long *in_RSI;
  long *in_RDI;
  undefined1 auVar7 [16];
  __m128 _p;
  __m128 _max;
  __m128 _min;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  Mat *m;
  undefined8 local_228;
  undefined8 uStack_220;
  int local_1f8;
  undefined1 (*local_1a0) [16];
  int local_194;
  
  lVar5 = in_RSI[7];
  iVar6 = *(int *)((long)in_RSI + 0x2c) * (int)in_RSI[6] * *(int *)((long)in_RSI + 0x34) *
          (int)in_RSI[3];
  for (local_194 = 0; local_194 < (int)lVar5; local_194 = local_194 + 1) {
    local_1a0 = (undefined1 (*) [16])(*in_RSI + in_RSI[8] * (long)local_194 * in_RSI[2]);
    local_1f8 = 0;
    uVar2 = *(undefined4 *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
    auVar3._4_4_ = uVar2;
    auVar3._0_4_ = uVar2;
    auVar3._12_4_ = uVar2;
    auVar3._8_4_ = uVar2;
    uVar2 = *(undefined4 *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
    auVar4._4_4_ = uVar2;
    auVar4._0_4_ = uVar2;
    auVar4._12_4_ = uVar2;
    auVar4._8_4_ = uVar2;
    for (; local_1f8 + 3 < iVar6; local_1f8 = local_1f8 + 4) {
      auVar7 = maxps(*local_1a0,auVar3);
      auVar7 = minps(auVar7,auVar4);
      local_228 = auVar7._0_8_;
      uStack_220 = auVar7._8_8_;
      *(undefined8 *)*local_1a0 = local_228;
      *(undefined8 *)(*local_1a0 + 8) = uStack_220;
      local_1a0 = local_1a0 + 1;
    }
    for (; local_1f8 < iVar6; local_1f8 = local_1f8 + 1) {
      if (*(float *)*local_1a0 < *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0)) {
        *(undefined4 *)*local_1a0 =
             *(undefined4 *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
      }
      pfVar1 = (float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
      if (*pfVar1 <= *(float *)*local_1a0 && *(float *)*local_1a0 != *pfVar1) {
        *(undefined4 *)*local_1a0 =
             *(undefined4 *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
      }
      local_1a0 = (undefined1 (*) [16])(*local_1a0 + 4);
    }
  }
  return 0;
}

Assistant:

int Clip_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _min_avx512 = _mm512_set1_ps(min);
        __m512 _max_avx512 = _mm512_set1_ps(max);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = _mm512_max_ps(_p, _min_avx512);
            _p = _mm512_min_ps(_p, _max_avx512);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _min_avx = _mm256_set1_ps(min);
        __m256 _max_avx = _mm256_set1_ps(max);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = _mm256_max_ps(_p, _min_avx);
            _p = _mm256_min_ps(_p, _max_avx);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _min = _mm_set1_ps(min);
        __m128 _max = _mm_set1_ps(max);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = _mm_max_ps(_p, _min);
            _p = _mm_min_ps(_p, _max);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr < min)
                *ptr = min;
            if (*ptr > max)
                *ptr = max;
            ptr++;
        }
    }

    return 0;
}